

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O0

bool __thiscall JsonModelSerialiser::loadModel(JsonModelSerialiser *this,QByteArray *source)

{
  byte bVar1;
  undefined1 local_48 [8];
  QString loadString;
  QTextStream local_28 [8];
  QTextStream reader;
  QByteArray *source_local;
  JsonModelSerialiser *this_local;
  
  loadString.d.size._4_4_ = operator|(ReadOnly,Text);
  QTextStream::QTextStream
            (local_28,(QByteArray *)source,(QFlags_conflict1 *)(ulong)loadString.d.size._4_4_);
  QTextStream::readAll();
  bVar1 = (**(code **)(*(long *)&(this->super_AbstractStringSerialiser).
                                 super_AbstractModelSerialiser + 200))(this,local_48);
  QString::~QString((QString *)local_48);
  QTextStream::~QTextStream(local_28);
  return (bool)(bVar1 & 1);
}

Assistant:

bool JsonModelSerialiser::loadModel(const QByteArray &source)
{
    QTextStream reader(source, QIODevice::ReadOnly | QIODevice::Text);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    reader.setCodec(textCodec());
#endif
    QString loadString = reader.readAll();
    return loadModel(&loadString);
}